

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O2

void __thiscall cmExportSet::Compute(cmExportSet *this,cmLocalGenerator *lg)

{
  pointer ppcVar1;
  cmTargetExport *name;
  cmGeneratorTarget *pcVar2;
  pointer ppcVar3;
  
  ppcVar1 = (this->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->TargetExports).
                 super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1) {
    name = *ppcVar3;
    pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(lg,&name->TargetName);
    name->Target = pcVar2;
  }
  return;
}

Assistant:

void cmExportSet::Compute(cmLocalGenerator* lg)
{
  for (cmTargetExport* tgtExport : this->TargetExports) {
    tgtExport->Target = lg->FindGeneratorTargetToUse(tgtExport->TargetName);
  }
}